

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.h
# Opt level: O0

uint __thiscall kj::_::HashCoder::operator*(HashCoder *this,ArrayPtr<const_kj::String> arr)

{
  uint uVar1;
  uint uVar2;
  size_t sVar3;
  String *pSVar4;
  uint k;
  String *e;
  String *__end0;
  String *__begin0;
  ArrayPtr<const_kj::String> *__range2;
  uint h;
  uint r;
  uint m;
  HashCoder *this_local;
  ArrayPtr<const_kj::String> arr_local;
  
  arr_local.ptr = (String *)arr.size_;
  this_local = (HashCoder *)arr.ptr;
  sVar3 = ArrayPtr<const_kj::String>::size((ArrayPtr<const_kj::String> *)&this_local);
  __range2._4_4_ = (uint)(sVar3 << 2);
  __end0 = ArrayPtr<const_kj::String>::begin((ArrayPtr<const_kj::String> *)&this_local);
  pSVar4 = ArrayPtr<const_kj::String>::end((ArrayPtr<const_kj::String> *)&this_local);
  for (; __end0 != pSVar4; __end0 = __end0 + 1) {
    uVar1 = hashCode<kj::String_const&>(__end0);
    __range2._4_4_ =
         (uVar1 * 0x5bd1e995 >> 0x18 ^ uVar1 * 0x5bd1e995) * 0x5bd1e995 ^
         __range2._4_4_ * 0x5bd1e995;
  }
  uVar2 = (__range2._4_4_ >> 0xd ^ __range2._4_4_) * 0x5bd1e995;
  return uVar2 >> 0xf ^ uVar2;
}

Assistant:

inline uint HashCoder::operator*(ArrayPtr<T> arr) const {
  // Hash each array element to create a string of hashes, then murmur2 over those.
  //
  // TODO(perf): Choose a more-modern hash. (See hash.c++.)

  constexpr uint m = 0x5bd1e995;
  constexpr uint r = 24;
  uint h = arr.size() * sizeof(uint);

  for (auto& e: arr) {
    uint k = kj::hashCode(e);
    k *= m;
    k ^= k >> r;
    k *= m;
    h *= m;
    h ^= k;
  }

  h ^= h >> 13;
  h *= m;
  h ^= h >> 15;
  return h;
}